

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

t_int * tabread4_tilde_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  t_sample tVar6;
  float *pfVar7;
  t_sample cminusb;
  t_sample d;
  t_sample c;
  t_sample b;
  t_sample a;
  t_sample frac;
  int index;
  double findex;
  int i;
  double onset;
  t_word *wp;
  t_word *buf;
  int maxindex;
  int n;
  t_sample *out;
  t_sample *in;
  t_tabread4_tilde *x;
  t_int *w_local;
  
  lVar4 = w[1];
  _maxindex = (float *)w[3];
  buf._4_4_ = (int)w[4];
  lVar5 = *(long *)(lVar4 + 0x38);
  fVar1 = *(float *)(lVar4 + 0x4c);
  tVar6 = (t_sample)(*(int *)(lVar4 + 0x30) + -3);
  if (((int)tVar6 < 0) || (lVar5 == 0)) {
    while (buf._4_4_ != 0) {
      *_maxindex = 0.0;
      buf._4_4_ = buf._4_4_ + -1;
      _maxindex = _maxindex + 1;
    }
  }
  else {
    out = (t_sample *)w[2];
    for (findex._4_4_ = 0; findex._4_4_ < buf._4_4_; findex._4_4_ = findex._4_4_ + 1) {
      fVar2 = *out + fVar1;
      a = (t_sample)(int)fVar2;
      if ((int)a < 1) {
        a = 1.4013e-45;
        b = 0.0;
      }
      else if ((int)tVar6 < (int)a) {
        b = 1.0;
        a = tVar6;
      }
      else {
        b = fVar2 - (float)(int)a;
      }
      pfVar7 = (float *)(lVar5 + (long)(int)a * 8);
      fVar2 = pfVar7[-2];
      fVar3 = *pfVar7;
      *_maxindex = b * (-((1.0 - b) * 0.1666667) *
                        (((pfVar7[2] - fVar3) * -3.0 + (pfVar7[4] - fVar2)) * b +
                        fVar3 * -3.0 + fVar2 + fVar2 + pfVar7[4]) + (pfVar7[2] - fVar3)) + fVar3;
      _maxindex = _maxindex + 1;
      out = out + 1;
    }
  }
  w_local = w + 5;
  return w_local;
}

Assistant:

static t_int *tabread4_tilde_perform(t_int *w)
{
    t_tabread4_tilde *x = (t_tabread4_tilde *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    int maxindex;
    t_word *buf = x->x_vec, *wp;
    double onset = x->x_onset;
    int i;

    maxindex = x->x_npoints - 3;
    if(maxindex<0) goto zero;

    if (!buf) goto zero;

#if 0       /* test for spam -- I'm not ready to deal with this */
    for (i = 0,  xmax = 0, xmin = maxindex,  fp = in1; i < n; i++,  fp++)
    {
        t_sample f = *in1;
        if (f < xmin) xmin = f;
        else if (f > xmax) xmax = f;
    }
    if (xmax < xmin + x->c_maxextent) xmax = xmin + x->c_maxextent;
    for (i = 0, splitlo = xmin+ x->c_maxextent, splithi = xmax - x->c_maxextent,
        fp = in1; i < n; i++,  fp++)
    {
        t_sample f = *in1;
        if (f > splitlo && f < splithi) goto zero;
    }
#endif

    for (i = 0; i < n; i++)
    {
        double findex = *in++ + onset;
        int index = findex;
        t_sample frac,  a,  b,  c,  d, cminusb;
        if (index < 1)
            index = 1, frac = 0;
        else if (index > maxindex)
            index = maxindex, frac = 1;
        else frac = findex - index;
        wp = buf + index;
        a = wp[-1].w_float;
        b = wp[0].w_float;
        c = wp[1].w_float;
        d = wp[2].w_float;
        cminusb = c-b;
        *out++ = b + frac * (
            cminusb - 0.1666667f * (1.-frac) * (
                (d - a - 3.0f * cminusb) * frac + (d + 2.0f*a - 3.0f*b)
            )
        );
    }
    return (w+5);
 zero:
    while (n--) *out++ = 0;

    return (w+5);
}